

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall
front::syntax::SyntaxAnalyze::hp_gn_binary_mir
          (SyntaxAnalyze *this,string *tmpName,SharedExNdPtr *first,SharedExNdPtr *second,Op op)

{
  element_type *peVar1;
  pointer pcVar2;
  anon_class_1_0_00000001 local_f1;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  byte local_d0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  byte local_a8;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  byte local_80;
  RightVal local_78;
  RightVal local_50;
  
  local_a0._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_80 = 0;
  local_f0._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_d0 = 0;
  peVar1 = (first->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1->_type == CNS) {
    local_a0._M_first._M_storage = (_Uninitialized<int,_true>)peVar1->_value;
    local_80 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0._M_first);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_a0._M_first,&peVar1->_name);
  }
  peVar1 = (second->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1->_type == CNS) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_d0]._M_data)
              (&local_f1,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f0._M_first);
    local_f0._M_first._M_storage = (_Uninitialized<int,_true>)peVar1->_value;
    local_d0 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f0._M_first);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_f0._M_first,&peVar1->_name);
  }
  local_c8._0_8_ = (long)&local_c8 + 0x10;
  pcVar2 = (tmpName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + tmpName->_M_string_length);
  local_a8 = 1;
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_50,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_first);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_78,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f0._M_first);
  irGenerator::irGenerator::ir_op
            (&this->irGenerator,(LeftVal *)&local_c8._M_first,&local_50,&local_78,op);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_78.
     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_f1,&local_78);
  local_78.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_50.
     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_f1,&local_50);
  local_50.
  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_a8]._M_data)
            (&local_f1,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c8._M_first);
  local_a8 = 0xff;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_d0]._M_data)
            (&local_f1,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f0._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_80]._M_data)
            ((anon_class_1_0_00000001 *)&local_f0._M_first,
             (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a0._M_first);
  return;
}

Assistant:

void SyntaxAnalyze::hp_gn_binary_mir(string tmpName, SharedExNdPtr first,
                                     SharedExNdPtr second, Op op) {
  RightVal op1;
  RightVal op2;

  if (first->_type == NodeType::CNS) {
    op1.emplace<0>(first->_value);
  } else {
    op1 = first->_name;
  }
  if (second->_type == NodeType::CNS) {
    op2.emplace<0>(second->_value);
  } else {
    op2 = second->_name;
  }
  irGenerator.ir_op(tmpName, op1, op2, op);
}